

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Steiner.h
# Opt level: O0

void __thiscall Steiner::~Steiner(Steiner *this)

{
  string *in_RDI;
  vector<Edge,_std::allocator<Edge>_> *unaff_retaddr;
  
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<Edge,_std::allocator<Edge>_>::~vector(unaff_retaddr);
  std::vector<Edge,_std::allocator<Edge>_>::~vector(unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<std::tuple<int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>::
  ~vector((vector<std::tuple<int,_int,_int,_int>,_std::allocator<std::tuple<int,_int,_int,_int>_>_>
           *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x115eb7)
  ;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>::~vector
            ((vector<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_> *)
             unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x115efb)
  ;
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)unaff_retaddr);
  std::vector<Edge,_std::allocator<Edge>_>::~vector(unaff_retaddr);
  std::vector<Point,_std::allocator<Point>_>::~vector
            ((vector<Point,_std::allocator<Point>_> *)unaff_retaddr);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

~Steiner() {}